

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeCommandListAppendMemAdvisePrologue
          (ZEParameterValidation *this,ze_command_list_handle_t hCommandList,
          ze_device_handle_t hDevice,void *ptr,size_t size,ze_memory_advice_t advice)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (hDevice != (ze_device_handle_t)0x0 && hCommandList != (ze_command_list_handle_t)0x0) {
    if (ptr == (void *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    if ((int)advice < 10) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeCommandListAppendMemAdvisePrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_advice_t advice                       ///< [in] Memory advice for the memory range
        )
    {
        if( nullptr == hCommandList )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == ptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_MEMORY_ADVICE_CLEAR_SYSTEM_MEMORY_PREFERRED_LOCATION < advice )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ZE_RESULT_SUCCESS;
    }